

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImVector<ImGuiPopupData> *this;
  float fVar1;
  ImGuiWindow *pIVar2;
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiContext *g;
  ImGuiIO *pIVar7;
  ImDrawList **ppIVar8;
  ImGuiPopupData *pIVar9;
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *tab;
  ImGuiWindow **ppIVar10;
  char *pcVar11;
  char *label;
  char *pcVar12;
  undefined8 uVar13;
  int i;
  int iVar14;
  uint i_00;
  long lVar15;
  int i_1;
  char *pcVar16;
  int n;
  ImDrawList *this_00;
  ImRect IVar17;
  ImVec2 local_180;
  char *wrt_rects_names [7];
  ImRect r;
  
  bVar6 = Begin("Dear ImGui Metrics",p_open,0);
  pIVar4 = GImGui;
  if (bVar6) {
    wrt_rects_names[6] = "ContentsRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Contents";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    pIVar7 = GetIO();
    iVar14 = 0;
    Text("Dear ImGui %s","1.74 WIP");
    Text("Application average %.3f ms/frame (%.1f FPS)",
         SUB84((double)(1000.0 / pIVar7->Framerate),0),(double)pIVar7->Framerate);
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)pIVar7->MetricsRenderVertices,
         (ulong)(uint)pIVar7->MetricsRenderIndices,
         (long)pIVar7->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)pIVar7->MetricsActiveWindows,
         (ulong)(uint)pIVar7->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)pIVar7->MetricsActiveAllocations);
    Separator();
    windows = &pIVar4->Windows;
    ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
    bVar6 = TreeNode("DrawList","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar4->DrawDataBuilder).Layers[0].Size);
    if (bVar6) {
      for (; iVar14 < (pIVar4->DrawDataBuilder).Layers[0].Size; iVar14 = iVar14 + 1) {
        ppIVar8 = ImVector<ImDrawList_*>::operator[]((pIVar4->DrawDataBuilder).Layers,iVar14);
        ShowMetricsWindow::Funcs::NodeDrawList((ImGuiWindow *)0x0,*ppIVar8,label);
      }
      TreePop();
    }
    bVar6 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar4->OpenPopupStack).Size);
    if (bVar6) {
      this = &pIVar4->OpenPopupStack;
      for (iVar14 = 0; iVar14 < this->Size; iVar14 = iVar14 + 1) {
        pIVar9 = ImVector<ImGuiPopupData>::operator[](this,iVar14);
        pIVar2 = pIVar9->Window;
        pIVar9 = ImVector<ImGuiPopupData>::operator[](this,iVar14);
        pcVar11 = "";
        pcVar12 = "NULL";
        pcVar16 = "";
        if (pIVar2 != (ImGuiWindow *)0x0) {
          pcVar12 = pIVar2->Name;
          pcVar11 = " ChildWindow";
          if (((uint)pIVar2->Flags >> 0x18 & 1) == 0) {
            pcVar11 = "";
          }
          pcVar16 = " ChildMenu";
          if (((uint)pIVar2->Flags >> 0x1c & 1) == 0) {
            pcVar16 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar9->PopupId,pcVar12,pcVar11,
                   pcVar16);
      }
      TreePop();
    }
    bVar6 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar4->TabBars).Data.Size);
    if (bVar6) {
      for (iVar14 = 0; iVar14 < (pIVar4->TabBars).Data.Size; iVar14 = iVar14 + 1) {
        tab_bar = ImVector<ImGuiTabBar>::operator[](&(pIVar4->TabBars).Data,iVar14);
        pcVar12 = "";
        if (tab_bar->PrevFrameVisible < GImGui->FrameCount + -2) {
          pcVar12 = " *Inactive*";
        }
        ImFormatString((char *)&r,0x100,"TabBar (%d tabs)%s",(ulong)(uint)(tab_bar->Tabs).Size,
                       pcVar12);
        bVar6 = TreeNode(tab_bar,"%s",&r);
        if (bVar6) {
          for (i_00 = 0; (int)i_00 < (tab_bar->Tabs).Size; i_00 = i_00 + 1) {
            tab = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i_00);
            PushID(tab);
            bVar6 = SmallButton("<");
            if (bVar6) {
              TabBarQueueChangeTabOrder(tab_bar,tab,-1);
            }
            SameLine(0.0,2.0);
            bVar6 = SmallButton(">");
            if (bVar6) {
              TabBarQueueChangeTabOrder(tab_bar,tab,1);
            }
            SameLine(0.0,-1.0);
            uVar13 = 0x2a;
            if (tab->ID != tab_bar->SelectedTabId) {
              uVar13 = 0x20;
            }
            Text("%02d%c Tab 0x%08X",(ulong)i_00,uVar13);
            PopID();
          }
          TreePop();
        }
      }
      TreePop();
    }
    bVar6 = TreeNode("Internal state");
    if (bVar6) {
      pcVar11 = "NULL";
      pcVar12 = "NULL";
      if (pIVar4->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar12 = pIVar4->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar12);
      pcVar12 = "NULL";
      if (pIVar4->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar12 = pIVar4->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar12);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
           SUB84((double)pIVar4->HoveredIdTimer,0),(ulong)pIVar4->HoveredId,
           (ulong)pIVar4->HoveredIdPreviousFrame,(ulong)pIVar4->HoveredIdAllowOverlap);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar4->ActiveIdTimer,0),(ulong)pIVar4->ActiveId,
           (ulong)pIVar4->ActiveIdPreviousFrame,(ulong)pIVar4->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001d98a0 + (ulong)pIVar4->ActiveIdSource * 8));
      pcVar12 = "NULL";
      if (pIVar4->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar12 = pIVar4->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar12);
      pcVar12 = "NULL";
      if (pIVar4->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar12 = pIVar4->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar12);
      pcVar12 = "NULL";
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        pcVar12 = pIVar4->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar12);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar4->NavId,(ulong)pIVar4->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001d98a0 + (ulong)pIVar4->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar4->IO).NavActive,
           (ulong)(pIVar4->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar4->NavActivateId,
           (ulong)pIVar4->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar4->NavDisableHighlight,
           (ulong)pIVar4->NavDisableMouseHover);
      if (pIVar4->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar4->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar11);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar4->DragDropActive,(ulong)(pIVar4->DragDropPayload).SourceId,
           (pIVar4->DragDropPayload).DataType,(ulong)(uint)(pIVar4->DragDropPayload).DataSize);
      TreePop();
    }
    bVar6 = TreeNode("Tools");
    if (bVar6) {
      auVar3._8_8_ = 0;
      auVar3._0_4_ = r.Max.x;
      auVar3._4_4_ = r.Max.y;
      r = (ImRect)(auVar3 << 0x40);
      bVar6 = Button("Item Picker..",&r.Min);
      if (bVar6) {
        GImGui->DebugItemPickerActive = true;
      }
      Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
      Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
      SameLine(0.0,-1.0);
      pIVar5 = GImGui;
      fVar1 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar5->NextItemData).Width = fVar1 * 12.0;
      bVar6 = Combo("##show_windows_rect_type",&ShowMetricsWindow::show_windows_rect_type,
                    wrt_rects_names,7,-1);
      ShowMetricsWindow::show_windows_rects = (bool)(ShowMetricsWindow::show_windows_rects | bVar6);
      if ((ShowMetricsWindow::show_windows_rects != false) &&
         (pIVar4->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar4->NavWindow->Name);
        Indent(0.0);
        for (lVar15 = 0; lVar15 != 7; lVar15 = lVar15 + 1) {
          IVar17 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar4->NavWindow,(int)lVar15);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar17.Min.x,0),
               (double)IVar17.Min.y,(double)IVar17.Max.x,(double)IVar17.Max.y,
               (double)(IVar17.Max.x - IVar17.Min.x),(double)(IVar17.Max.y - IVar17.Min.y),
               wrt_rects_names[lVar15]);
        }
        Unindent(0.0);
      }
      Checkbox("Show clipping rectangle when hovering ImDrawCmd node",
               &ShowMetricsWindow::show_drawcmd_clip_rects);
      TreePop();
    }
    if ((ShowMetricsWindow::show_windows_rects != false) ||
       (ShowMetricsWindow::show_windows_begin_order == true)) {
      for (iVar14 = 0; iVar14 < windows->Size; iVar14 = iVar14 + 1) {
        ppIVar10 = ImVector<ImGuiWindow_*>::operator[](windows,iVar14);
        pIVar2 = *ppIVar10;
        if (pIVar2->WasActive == true) {
          this_00 = &GImGui->ForegroundDrawList;
          if (ShowMetricsWindow::show_windows_rects == true) {
            r = ShowMetricsWindow::Funcs::GetWindowRect
                          (pIVar2,ShowMetricsWindow::show_windows_rect_type);
            ImDrawList::AddRect(this_00,&r.Min,&r.Max,0xff8000ff,0.0,0xf,1.0);
          }
          if ((ShowMetricsWindow::show_windows_begin_order == true) &&
             ((pIVar2->Flags & 0x1000000) == 0)) {
            ImFormatString((char *)&r,0x20,"%d",(ulong)(uint)(int)pIVar2->BeginOrderWithinContext);
            local_180.y = GImGui->FontSize + (pIVar2->Pos).y;
            local_180.x = GImGui->FontSize + (pIVar2->Pos).x;
            ImDrawList::AddRectFilled(this_00,&pIVar2->Pos,&local_180,0xff6464c8,0.0,0xf);
            ImDrawList::AddText(this_00,&pIVar2->Pos,0xffffffff,(char *)&r,(char *)0x0);
          }
        }
      }
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // State
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Contents, WRT_ContentsRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Contents", "ContentsRegionRect" };
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_drawcmd_clip_rects = true;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList
    // - NodeColumns
    // - NodeWindow
    // - NodeWindows
    // - NodeTabBar
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Contents)             { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentsRegionRect)   { return window->ContentsRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::Text("(Note: owning Window is inactive: DrawList is not being rendered!)");

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,0,255,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGui::Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d", pcmd->ElemCount, pcmd->ElemCount/3, pcmd->VtxOffset, pcmd->IdxOffset);
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "elem" : "    ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y);
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.size_in_bytes());
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

#if 0
    if (ImGui::TreeNode("Docking"))
    {
        ImGui::TreePop();
    }
#endif

#if 0
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.Data.Size))
    {
        ImGui::TreePop();
    }
#endif

    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show clipping rectangle when hovering ImDrawCmd node", &show_drawcmd_clip_rects);
        ImGui::TreePop();
    }

    // Tool: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }
    ImGui::End();
}